

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL> *
__thiscall
diligent_spirv_cross::
SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>::
operator=(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *this,SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined8 *puVar4;
  void *pvVar5;
  size_t sVar6;
  undefined8 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  clear(this);
  pbVar8 = (other->
           super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).ptr;
  if (pbVar8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &other->stack_storage) {
    reserve(this,(other->
                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).buffer_size);
    if ((other->
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).buffer_size == 0) {
      uVar9 = 0;
    }
    else {
      lVar11 = 0x10;
      uVar10 = 0;
      do {
        pbVar8 = (this->
                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).ptr;
        puVar1 = (undefined8 *)((long)&(pbVar8->_M_dataplus)._M_p + lVar11);
        pbVar3 = (other->
                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).ptr;
        puVar2 = (undefined8 *)((long)&(pbVar3->_M_dataplus)._M_p + lVar11);
        *(undefined8 **)((long)pbVar8 + lVar11 + -0x10) = puVar1;
        puVar4 = *(undefined8 **)((long)pbVar3 + lVar11 + -0x10);
        if (puVar2 == puVar4) {
          uVar7 = puVar2[1];
          *puVar1 = *puVar2;
          puVar1[1] = uVar7;
        }
        else {
          *(undefined8 **)((long)pbVar8 + lVar11 + -0x10) = puVar4;
          *(undefined8 *)((long)&(pbVar8->_M_dataplus)._M_p + lVar11) = *puVar2;
        }
        *(undefined8 *)((long)pbVar8 + lVar11 + -8) = *(undefined8 *)((long)pbVar3 + lVar11 + -8);
        *(undefined8 **)((long)pbVar3 + lVar11 + -0x10) = puVar2;
        *(undefined8 *)((long)pbVar3 + lVar11 + -8) = 0;
        *(undefined1 *)((long)&(pbVar3->_M_dataplus)._M_p + lVar11) = 0;
        pbVar8 = (other->
                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).ptr;
        pvVar5 = *(void **)((long)pbVar8 + lVar11 + -0x10);
        if ((void *)((long)&(pbVar8->_M_dataplus)._M_p + lVar11) != pvVar5) {
          operator_delete(pvVar5);
        }
        uVar10 = uVar10 + 1;
        uVar9 = (other->
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).buffer_size;
        lVar11 = lVar11 + 0x20;
      } while (uVar10 < uVar9);
    }
    (this->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).buffer_size = uVar9;
    (other->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).buffer_size = 0;
  }
  else {
    pbVar3 = (this->
             super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).ptr;
    if (pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &this->stack_storage) {
      free(pbVar3);
      pbVar8 = (other->
               super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).ptr;
    }
    (this->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).ptr = pbVar8;
    sVar6 = other->buffer_capacity;
    (this->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).buffer_size =
         (other->
         super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ).buffer_size;
    this->buffer_capacity = sVar6;
    (other->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    (other->
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}